

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

size_t build_certificate_verify_signdata
                 (uint8_t *data,st_ptls_key_schedule_t *sched,char *context_string)

{
  ulong uVar1;
  
  builtin_memcpy(data,
                 "                                                                TLS 1.3, server CertificateVerify"
                 ,0x62);
  (*sched->msghash->final)(sched->msghash,data + 0x62,PTLS_HASH_FINAL_MODE_SNAPSHOT);
  uVar1 = sched->algo->digest_size + 0x62;
  if (uVar1 < 0xe3) {
    return uVar1;
  }
  __assert_fail("datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                ,0x2f6,
                "size_t build_certificate_verify_signdata(uint8_t *, struct st_ptls_key_schedule_t *, const char *)"
               );
}

Assistant:

static size_t build_certificate_verify_signdata(uint8_t *data, struct st_ptls_key_schedule_t *sched, const char *context_string)
{
    size_t datalen = 0;

    memset(data + datalen, 32, 64);
    datalen += 64;
    memcpy(data + datalen, context_string, strlen(context_string) + 1);
    datalen += strlen(context_string) + 1;
    sched->msghash->final(sched->msghash, data + datalen, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    datalen += sched->algo->digest_size;
    assert(datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE);

    return datalen;
}